

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  NamePattern *this_local;
  
  ~NamePattern(this);
  operator_delete(this);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}